

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestream.h
# Opt level: O2

void __thiscall google::protobuf::strings::ArrayByteSource::~ArrayByteSource(ArrayByteSource *this)

{
  operator_delete(this);
  return;
}

Assistant:

class PROTOBUF_EXPORT ArrayByteSource : public ByteSource {
 public:
  explicit ArrayByteSource(StringPiece s) : input_(s) {}

  virtual size_t Available() const override;
  virtual StringPiece Peek() override;
  virtual void Skip(size_t n) override;

 private:
  StringPiece   input_;
  GOOGLE_DISALLOW_EVIL_CONSTRUCTORS(ArrayByteSource);
}